

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddNotDefinedError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *undefined_symbol)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->possible_undeclared_dependency_ == (FileDescriptor *)0x0) {
    if ((this->undefine_resolved_name_)._M_string_length == 0) {
      std::operator+(&local_d0,"\"",undefined_symbol);
      std::operator+(&local_f0,&local_d0,"\" is not defined.");
      AddError(this,element_name,descriptor,location,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      this_00 = &local_d0;
      goto LAB_0029ef6d;
    }
  }
  else {
    std::operator+(&local_50,"\"",&this->possible_undeclared_dependency_name_);
    std::operator+(&local_b0,&local_50,"\" seems to be defined in \"");
    std::operator+(&local_90,&local_b0,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    this->possible_undeclared_dependency_);
    std::operator+(&local_70,&local_90,"\", which is not imported by \"");
    std::operator+(&local_d0,&local_70,&this->filename_);
    std::operator+(&local_f0,&local_d0,"\".  To use it here, please add the necessary import.");
    AddError(this,element_name,descriptor,location,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    if ((this->undefine_resolved_name_)._M_string_length == 0) {
      return;
    }
  }
  std::operator+(&local_50,"\"",undefined_symbol);
  std::operator+(&local_b0,&local_50,"\" is resolved to \"");
  std::operator+(&local_90,&local_b0,&this->undefine_resolved_name_);
  std::operator+(&local_70,&local_90,
                 "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
                );
  std::operator+(&local_d0,&local_70,undefined_symbol);
  std::operator+(&local_f0,&local_d0,"\") to start from the outermost scope.");
  AddError(this,element_name,descriptor,location,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  this_00 = &local_50;
LAB_0029ef6d:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void DescriptorBuilder::AddNotDefinedError(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const std::string& undefined_symbol) {
  if (possible_undeclared_dependency_ == nullptr &&
      undefine_resolved_name_.empty()) {
    AddError(element_name, descriptor, location,
             "\"" + undefined_symbol + "\" is not defined.");
  } else {
    if (possible_undeclared_dependency_ != nullptr) {
      AddError(element_name, descriptor, location,
               "\"" + possible_undeclared_dependency_name_ +
                   "\" seems to be defined in \"" +
                   possible_undeclared_dependency_->name() +
                   "\", which is not "
                   "imported by \"" +
                   filename_ +
                   "\".  To use it here, please "
                   "add the necessary import.");
    }
    if (!undefine_resolved_name_.empty()) {
      AddError(element_name, descriptor, location,
               "\"" + undefined_symbol + "\" is resolved to \"" +
                   undefine_resolved_name_ +
                   "\", which is not defined. "
                   "The innermost scope is searched first in name resolution. "
                   "Consider using a leading '.'(i.e., \"." +
                   undefined_symbol + "\") to start from the outermost scope.");
    }
  }
}